

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

bool __thiscall Assembler::isInstruction(Assembler *this,string *line)

{
  bool bVar1;
  bool bVar2;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)line);
  bVar1 = checkIfNoOperand(this,&local_40);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_60,(string *)line);
    bVar1 = checkIfLdStr(this,&local_60);
    bVar2 = true;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_80,(string *)line);
      bVar1 = checkIfJump(this,&local_80);
      bVar2 = true;
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_a0,(string *)line);
        bVar1 = checkIfInstrWithTwoReg(this,&local_a0);
        bVar2 = true;
        if (!bVar1) {
          std::__cxx11::string::string((string *)&local_c0,(string *)line);
          bVar2 = checkIfOneOpReg(this,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        std::__cxx11::string::~string((string *)&local_a0);
      }
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar2 != false) {
    this->isLabelWithoutCode = false;
  }
  return bVar2;
}

Assistant:

bool Assembler::isInstruction(string line) {
    if (checkIfNoOperand(line) || checkIfLdStr(line) ||
        checkIfJump(line) || checkIfInstrWithTwoReg(line) || checkIfOneOpReg(line)) {
        isLabelWithoutCode = false;
        return true;
    } else return false;
}